

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O2

int xmlValidateNmtokensValueInternal(xmlDocPtr doc,xmlChar *value)

{
  uint c;
  int iVar1;
  undefined8 in_RAX;
  undefined8 uStack_38;
  int len;
  
  if (value != (xmlChar *)0x0) {
    uStack_38 = in_RAX;
    c = xmlStringCurrentChar((xmlParserCtxtPtr)0x0,value,&len);
    while( true ) {
      value = value + len;
      if (((0xff < (int)c) || (0x20 < c)) || ((0x100002600U >> ((ulong)c & 0x3f) & 1) == 0)) break;
      c = xmlStringCurrentChar((xmlParserCtxtPtr)0x0,value,&len);
    }
    iVar1 = xmlIsDocNameChar(doc,c);
    if (iVar1 != 0) {
      while (iVar1 = xmlIsDocNameChar(doc,c), iVar1 != 0) {
        c = xmlStringCurrentChar((xmlParserCtxtPtr)0x0,value,&len);
        value = value + len;
      }
      while( true ) {
        if (c != 0x20) {
          if (c == 0) {
            return 1;
          }
          return 0;
        }
        while (c == 0x20) {
          c = xmlStringCurrentChar((xmlParserCtxtPtr)0x0,value,&len);
          value = value + len;
        }
        if (c == 0) break;
        iVar1 = xmlIsDocNameChar(doc,c);
        if (iVar1 == 0) {
          return 0;
        }
        do {
          c = xmlStringCurrentChar((xmlParserCtxtPtr)0x0,value,&len);
          value = value + len;
          iVar1 = xmlIsDocNameChar(doc,c);
        } while (iVar1 != 0);
      }
      return 1;
    }
  }
  return 0;
}

Assistant:

static int
xmlValidateNmtokensValueInternal(xmlDocPtr doc, const xmlChar *value) {
    const xmlChar *cur;
    int val, len;

    if (value == NULL) return(0);
    cur = value;
    val = xmlStringCurrentChar(NULL, cur, &len);
    cur += len;

    while (IS_BLANK(val)) {
	val = xmlStringCurrentChar(NULL, cur, &len);
	cur += len;
    }

    if (!xmlIsDocNameChar(doc, val))
	return(0);

    while (xmlIsDocNameChar(doc, val)) {
	val = xmlStringCurrentChar(NULL, cur, &len);
	cur += len;
    }

    /* Should not test IS_BLANK(val) here -- see erratum E20*/
    while (val == 0x20) {
	while (val == 0x20) {
	    val = xmlStringCurrentChar(NULL, cur, &len);
	    cur += len;
	}
	if (val == 0) return(1);

	if (!xmlIsDocNameChar(doc, val))
	    return(0);

	val = xmlStringCurrentChar(NULL, cur, &len);
	cur += len;

	while (xmlIsDocNameChar(doc, val)) {
	    val = xmlStringCurrentChar(NULL, cur, &len);
	    cur += len;
	}
    }

    if (val != 0) return(0);

    return(1);
}